

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi_c.cpp
# Opt level: O0

int rtmidi_out_send_message(RtMidiOutPtr device,uchar *message,int length)

{
  RtMidiError *err;
  int length_local;
  uchar *message_local;
  RtMidiOutPtr device_local;
  
  RtMidiOut::sendMessage((RtMidiOut *)device->ptr,message,(long)length);
  return 0;
}

Assistant:

int rtmidi_out_send_message (RtMidiOutPtr device, const unsigned char *message, int length)
{
    try {
        ((RtMidiOut*) device->ptr)->sendMessage (message, length);
        return 0;
    }
    catch (const RtMidiError & err) {
        device->ok  = false;
        device->msg = err.what ();
        return -1;
    }
    catch (...) {
        device->ok  = false;
        device->msg = "Unknown error";
        return -1;
    }
}